

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::isSubnodeExistsInNode(Analyzer *this,Node *node,Node *subnode)

{
  bool bVar1;
  Node *pNVar2;
  reference ppNVar3;
  Node *in_RDX;
  Analyzer *in_RSI;
  Node *in_RDI;
  size_t i;
  Node *pNVar4;
  Node *subnode_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isNodeEquals((Analyzer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI,(Node *)in_RSI);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    pNVar4 = (Node *)0x0;
    while (subnode_00 = pNVar4,
          pNVar2 = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::size
                                     ((vector<Node_*,_std::allocator<Node_*>_> *)
                                      &(in_RSI->requiredModuleNames)._M_t._M_impl.
                                       super__Rb_tree_header._M_header._M_left), pNVar4 < pNVar2) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,(size_type)subnode_00);
      if (*ppNVar3 != (value_type)0x0) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                   &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left,(size_type)subnode_00);
        bVar1 = isSubnodeExistsInNode(in_RSI,in_RDX,subnode_00);
        if (bVar1) {
          return true;
        }
      }
      pNVar4 = (Node *)((long)&(subnode_00->super_Poolable).ctx + 1);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isSubnodeExistsInNode(Node * node, Node * subnode)
  {
    if (isNodeEquals(node, subnode))
      return true;

    for (size_t i = 0; i < node->children.size(); i++)
      if (node->children[i])
        if (isSubnodeExistsInNode(node->children[i], subnode))
          return true;

    return false;
  }